

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
               (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                *vis,basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                     *arg)

{
  handle handle;
  basic_string_view<char> value;
  printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this;
  custom_value<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  *in_RSI;
  printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *in_RDI;
  printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined5 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff97;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 uVar1;
  undefined6 in_stack_ffffffffffffff9a;
  undefined6 uVar2;
  handle local_38;
  basic_string_view<char> local_28 [2];
  basic_buffer<char> *local_8;
  
  this = (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
          *)(ulong)*(uint *)&in_RSI[1].value;
  switch(this) {
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x0:
  default:
switchD_001457b8_default:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
              ::operator()(in_RDI);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x1:
    goto switchD_001457b8_default;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x2:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()(in_stack_ffffffffffffff88,0);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x3:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()(in_stack_ffffffffffffff88,0);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x4:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()(in_stack_ffffffffffffff88,0x14580c);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x5:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()(in_stack_ffffffffffffff88,0x145828);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x6:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()((printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                            *)CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                           (bool)in_stack_ffffffffffffff97);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x7:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()((printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                            *)CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff97);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x8:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()(in_stack_ffffffffffffff88,6.58779227114385e-318);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0x9:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
              ::operator()(this,(longdouble)
                                CONCAT28(in_stack_ffffffffffffff98,
                                         CONCAT17(in_stack_ffffffffffffff97,
                                                  CONCAT52(in_stack_ffffffffffffff92,
                                                           (short)((unkuint10)*(unkbyte10 *)in_RSI
                                                                  >> 0x40)))));
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0xa:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
              ::operator()((printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                            *)CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                           (char *)CONCAT17(in_stack_ffffffffffffff97,
                                            CONCAT52(in_stack_ffffffffffffff92,
                                                     in_stack_ffffffffffffff90)));
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0xb:
    basic_string_view<char>::basic_string_view
              (local_28,(char *)in_RSI->value,(size_t)in_RSI->format);
    value.size_ = (size_t)this;
    value.data_ = (char *)in_RDI;
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
              ::operator()((printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                            *)CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),value);
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0xc:
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
              ::operator()((printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                            *)CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                           (void *)CONCAT17(in_stack_ffffffffffffff97,
                                            CONCAT52(in_stack_ffffffffffffff92,
                                                     in_stack_ffffffffffffff90)));
    break;
  case (printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
       0xd:
    uVar1 = SUB82(in_RDI,0);
    uVar2 = (undefined6)((ulong)in_RDI >> 0x10);
    basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
    ::handle::handle(&local_38,*in_RSI);
    handle.custom_.value._2_5_ = in_stack_ffffffffffffff92;
    handle.custom_.value._0_2_ = in_stack_ffffffffffffff90;
    handle.custom_.value._7_1_ = in_stack_ffffffffffffff97;
    handle.custom_.format._0_2_ = uVar1;
    handle.custom_.format._2_6_ = uVar2;
    local_8 = (basic_buffer<char> *)
              printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
              ::operator()(in_stack_ffffffffffffff88,handle);
  }
  return (type)local_8;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}